

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::find_position<A>(dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                   *this,A *key)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  uVar4 = (ulong)key->_i;
  uVar2 = 0xffffffffffffffff;
  lVar3 = 1;
  uVar5 = 0xffffffffffffffff;
  while( true ) {
    uVar4 = uVar4 & this->num_buckets - 1;
    iVar1 = this->table[uVar4]._i;
    if ((this->key_info).empty_key._i == iVar1) break;
    if ((this->num_deleted == 0) || ((this->key_info).delkey._i != iVar1)) {
      if (key->_i == iVar1) goto LAB_009c1b3e;
    }
    else if (uVar5 == 0xffffffffffffffff) {
      uVar5 = uVar4;
    }
    uVar4 = uVar4 + lVar3;
    lVar3 = lVar3 + 1;
  }
  uVar2 = uVar4;
  if (uVar5 != 0xffffffffffffffff) {
    uVar2 = uVar5;
  }
  uVar4 = 0xffffffffffffffff;
LAB_009c1b3e:
  pVar6.second = uVar2;
  pVar6.first = uVar4;
  return pVar6;
}

Assistant:

size_type bucket_count() const { return num_buckets; }